

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::zeroBoundaryVisc
          (PeleLM *this,MultiFab **beta,Real param_2,int state_comp,int dst_comp,int ncomp)

{
  int dir;
  long lVar1;
  MFIter mfi;
  Array4<double> local_e8;
  GeometryData geomdata;
  
  amrex::Geometry::data(&(this->super_NavierStokesBase).super_AmrLevel.geom);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)beta[lVar1],true);
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::growntilebox((Box *)&local_e8,&mfi,-1000000);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_e8,&beta[lVar1]->super_FabArray<amrex::FArrayBox>,&mfi,dst_comp);
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
PeleLM::zeroBoundaryVisc (MultiFab*  beta[AMREX_SPACEDIM],
                          const Real /*time*/,
                          const int  state_comp,
                          const int  dst_comp,
                          const int  ncomp) const
{
  AMREX_ASSERT(state_comp > Density);

  const auto geomdata = geom.data();

  for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
  {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
      const Box edom = amrex::surroundingNodes(geom.Domain(),dir);
      for (MFIter mfi(*(beta[dir]),TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
        const Box& ebox     = amrex::surroundingNodes(mfi.growntilebox(),dir);
        auto const& beta_arr = beta[dir]->array(mfi,dst_comp);
        amrex::ParallelFor(ebox, [beta_arr,dir,geomdata,edom,state_comp,ncomp]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
          zero_visc(i, j, k, beta_arr, geomdata, edom, dir, state_comp, ncomp);
        });
      }
    }
  }
}